

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

void __thiscall basisu::basisu_frontend::generate_endpoint_clusters(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *parent_codebook;
  uint32_t uVar1;
  job_pool *pjVar2;
  void *__ptr;
  uint *puVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  undefined8 in_RAX;
  ulong uVar7;
  vector<unsigned_int> *pvVar8;
  char *__function;
  uint32_t new_size;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  uchar uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  undefined8 local_38;
  
  local_38 = in_RAX;
  debug_printf("Begin endpoint quantization\n");
  uVar13 = (this->m_params).m_max_endpoint_clusters;
  uVar9 = 0;
  if ((this->m_params).m_multithreaded == true) {
    uVar6 = std::thread::hardware_concurrency();
    uVar9 = 8;
    if ((int)uVar6 < 8) {
      uVar9 = uVar6;
    }
  }
  pjVar2 = (this->m_params).m_pJob_pool;
  uVar6 = uVar9;
  if ((pjVar2 != (job_pool *)0x0) &&
     (uVar6 = (int)((ulong)((long)(pjVar2->m_threads).
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pjVar2->m_threads).
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + 1,
     (int)uVar9 <= (int)uVar6)) {
    uVar6 = uVar9;
  }
  debug_printf("max_threads: %u\n",(ulong)uVar6);
  parent_codebook = &this->m_endpoint_parent_clusters;
  bVar5 = generate_hierarchical_codebook_threaded<basisu::tree_vector_quant<basisu::vec<6u,float>>>
                    (&this->m_endpoint_clusterizer,(this->m_params).m_max_endpoint_clusters,
                     (uint)(byte)(0xff < uVar13 & this->m_use_hierarchical_endpoint_codebooks) << 4,
                     &this->m_endpoint_clusters,parent_codebook,uVar6,(this->m_params).m_pJob_pool,
                     true);
  if (!bVar5) {
    uVar10 = 0x391;
LAB_00230bed:
    error_printf("basisu_frontend: verify check failed at line %i!\n",uVar10);
    abort();
  }
  if (this->m_use_hierarchical_endpoint_codebooks != true) goto LAB_00230b85;
  if ((this->m_endpoint_parent_clusters).m_size == 0) {
    uVar1 = (this->m_endpoint_parent_clusters).m_size;
    if (uVar1 == 0) {
      if ((this->m_endpoint_parent_clusters).m_capacity == 0) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)parent_codebook,1,true,0x10,(object_mover)0x0,false);
      }
      uVar13 = (this->m_endpoint_parent_clusters).m_size;
      if ((ulong)uVar13 != 1) {
        memset(parent_codebook->m_p + uVar13,0,(ulong)(1 - uVar13) << 4);
      }
LAB_002308ec:
      (this->m_endpoint_parent_clusters).m_size = 1;
    }
    else if (uVar1 != 1) {
      pvVar8 = parent_codebook->m_p;
      lVar15 = 0;
      do {
        __ptr = *(void **)((long)&pvVar8[1].m_p + lVar15);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar15 = lVar15 + 0x10;
      } while ((ulong)(uVar1 - 1) << 4 != lVar15);
      goto LAB_002308ec;
    }
    if (this->m_total_blocks != 0) {
      uVar13 = 0;
      iVar14 = 1;
      do {
        if ((this->m_endpoint_parent_clusters).m_size == 0) {
LAB_00230c07:
          __function = 
          "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
          ;
          goto LAB_00230bc9;
        }
        pvVar8 = parent_codebook->m_p;
        local_38 = CONCAT44(iVar14 + -1,(uint)local_38);
        puVar3 = pvVar8->m_p;
        uVar9 = pvVar8->m_size;
        if ((uint *)((long)&local_38 + 4U) < puVar3 + uVar9 &&
            (puVar3 <= (uint *)((long)&local_38 + 4U) && puVar3 != (uint *)0x0)) {
LAB_00230c1e:
          __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x267,
                        "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                       );
        }
        if (pvVar8->m_capacity <= uVar9) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar8,uVar9 + 1,true,4,(object_mover)0x0,false);
        }
        pvVar8->m_p[pvVar8->m_size] = local_38._4_4_;
        pvVar8->m_size = pvVar8->m_size + 1;
        if ((this->m_endpoint_parent_clusters).m_size == 0) goto LAB_00230c07;
        pvVar8 = parent_codebook->m_p;
        local_38 = CONCAT44(local_38._4_4_,iVar14);
        puVar3 = pvVar8->m_p;
        uVar9 = pvVar8->m_size;
        if (&local_38 < puVar3 + uVar9 && (puVar3 <= &local_38 && puVar3 != (uint *)0x0))
        goto LAB_00230c1e;
        if (pvVar8->m_capacity <= uVar9) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar8,uVar9 + 1,true,4,(object_mover)0x0,false);
        }
        pvVar8->m_p[pvVar8->m_size] = (uint)local_38;
        pvVar8->m_size = pvVar8->m_size + 1;
        uVar13 = uVar13 + 1;
        iVar14 = iVar14 + 2;
      } while (uVar13 < this->m_total_blocks);
    }
  }
  if ((this->m_block_parent_endpoint_cluster).m_size != 0) {
    (this->m_block_parent_endpoint_cluster).m_size = 0;
  }
  uVar13 = this->m_total_blocks;
  uVar9 = (this->m_block_parent_endpoint_cluster).m_size;
  if (uVar9 != uVar13) {
    if (uVar9 <= uVar13) {
      if ((this->m_block_parent_endpoint_cluster).m_capacity < uVar13) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_block_parent_endpoint_cluster,uVar13,
                   uVar9 + 1 == uVar13,1,(object_mover)0x0,false);
      }
      uVar9 = (this->m_block_parent_endpoint_cluster).m_size;
      memset((this->m_block_parent_endpoint_cluster).m_p + uVar9,0,(ulong)(uVar13 - uVar9));
    }
    (this->m_block_parent_endpoint_cluster).m_size = uVar13;
  }
  if ((this->m_block_parent_endpoint_cluster).m_size != 0) {
    uVar7 = 0;
    do {
      (this->m_block_parent_endpoint_cluster).m_p[uVar7] = 0xff;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->m_block_parent_endpoint_cluster).m_size);
  }
  if ((this->m_endpoint_parent_clusters).m_size != 0) {
    uVar7 = 0;
    do {
      if (parent_codebook->m_p[uVar7].m_size != 0) {
        pvVar8 = parent_codebook->m_p + uVar7;
        lVar15 = 0;
        do {
          uVar13 = pvVar8->m_p[lVar15] >> 1;
          if ((this->m_block_parent_endpoint_cluster).m_size <= uVar13) goto LAB_00230bb4;
          (this->m_block_parent_endpoint_cluster).m_p[uVar13] = (uchar)uVar7;
          lVar15 = lVar15 + 1;
        } while ((uint)lVar15 < pvVar8->m_size);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->m_endpoint_parent_clusters).m_size);
  }
  if (this->m_total_blocks != 0) {
    lVar15 = 0;
    do {
      if ((this->m_block_parent_endpoint_cluster).m_size == (uint32_t)lVar15) {
LAB_00230bb4:
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
LAB_00230bc9:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,__function);
      }
      if ((this->m_block_parent_endpoint_cluster).m_p[lVar15] == 0xff) {
        uVar10 = 0x3b1;
        goto LAB_00230bed;
      }
      lVar15 = lVar15 + 1;
    } while (this->m_total_blocks != (uint32_t)lVar15);
  }
  uVar7 = (ulong)(this->m_endpoint_clusters).m_size;
  if (uVar7 != 0) {
    pvVar8 = (this->m_endpoint_clusters).m_p;
    puVar4 = (this->m_block_parent_endpoint_cluster).m_p;
    uVar11 = 0;
    do {
      uVar1 = pvVar8[uVar11].m_size;
      if (uVar1 != 0) {
        lVar15 = 0;
        uVar12 = '\0';
        do {
          uVar13 = pvVar8[uVar11].m_p[lVar15] >> 1;
          if ((this->m_block_parent_endpoint_cluster).m_size <= uVar13) {
            uVar10 = 0x3be;
            goto LAB_00230bed;
          }
          if ((int)lVar15 == 0) {
            uVar12 = puVar4[uVar13];
          }
          else if (uVar12 != puVar4[uVar13]) {
            uVar10 = 0x3c6;
            goto LAB_00230bed;
          }
          lVar15 = lVar15 + 1;
        } while (uVar1 != (uint32_t)lVar15);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar7);
  }
LAB_00230b85:
  if ((this->m_params).m_debug_stats == true) {
    debug_printf("Total endpoint clusters: %u, parent clusters: %u\n",
                 (ulong)(this->m_endpoint_clusters).m_size,
                 (ulong)(this->m_endpoint_parent_clusters).m_size);
  }
  return;
}

Assistant:

void basisu_frontend::generate_endpoint_clusters()
	{
		debug_printf("Begin endpoint quantization\n");

		const uint32_t parent_codebook_size = (m_params.m_max_endpoint_clusters >= 256) ? BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE : 0;
		uint32_t max_threads = 0;
		max_threads = m_params.m_multithreaded ? minimum<int>(std::thread::hardware_concurrency(), cMaxCodebookCreationThreads) : 0;
		if (m_params.m_pJob_pool)
			max_threads = minimum<int>((int)m_params.m_pJob_pool->get_total_threads(), max_threads);

		debug_printf("max_threads: %u\n", max_threads);
		bool status = generate_hierarchical_codebook_threaded(m_endpoint_clusterizer,
			m_params.m_max_endpoint_clusters, m_use_hierarchical_endpoint_codebooks ? parent_codebook_size : 0,
			m_endpoint_clusters,
			m_endpoint_parent_clusters,
			max_threads, m_params.m_pJob_pool, true);
		BASISU_FRONTEND_VERIFY(status);

		if (m_use_hierarchical_endpoint_codebooks)
		{
			if (!m_endpoint_parent_clusters.size())
			{
				m_endpoint_parent_clusters.resize(0);
				m_endpoint_parent_clusters.resize(1);
				for (uint32_t i = 0; i < m_total_blocks; i++)
				{
					m_endpoint_parent_clusters[0].push_back(i*2);
					m_endpoint_parent_clusters[0].push_back(i*2+1);
				}
			}

			BASISU_ASSUME(BASISU_ENDPOINT_PARENT_CODEBOOK_SIZE <= UINT8_MAX);

			m_block_parent_endpoint_cluster.resize(0);
			m_block_parent_endpoint_cluster.resize(m_total_blocks);
			vector_set_all(m_block_parent_endpoint_cluster, 0xFF);
			for (uint32_t parent_cluster_index = 0; parent_cluster_index < m_endpoint_parent_clusters.size(); parent_cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_parent_clusters[parent_cluster_index];
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					m_block_parent_endpoint_cluster[block_index] = static_cast<uint8_t>(parent_cluster_index);
				}
			}

			for (uint32_t i = 0; i < m_total_blocks; i++)
			{
				BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[i] != 0xFF);
			}

			// Ensure that all the blocks within each cluster are all in the same parent cluster, or something is very wrong.
			for (uint32_t cluster_index = 0; cluster_index < m_endpoint_clusters.size(); cluster_index++)
			{
				const uint_vec &cluster = m_endpoint_clusters[cluster_index];
			
				uint32_t parent_cluster_index = 0;
				for (uint32_t j = 0; j < cluster.size(); j++)
				{
					const uint32_t block_index = cluster[j] >> 1;
					
					BASISU_FRONTEND_VERIFY(block_index < m_block_parent_endpoint_cluster.size());

					if (!j)
					{
						parent_cluster_index = m_block_parent_endpoint_cluster[block_index];
					}
					else
					{
						BASISU_FRONTEND_VERIFY(m_block_parent_endpoint_cluster[block_index] == parent_cluster_index);
					}
				}
			}
		}
								
		if (m_params.m_debug_stats)
			debug_printf("Total endpoint clusters: %u, parent clusters: %u\n", (uint32_t)m_endpoint_clusters.size(), (uint32_t)m_endpoint_parent_clusters.size());
	}